

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

void __thiscall
zmq::router_t::xattach_pipe
          (router_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined7 in_register_00000009;
  char *__n;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  msg_t *pmVar5;
  pipe_t *pipe__local;
  msg_t probe_msg;
  
  __n = (char *)CONCAT71(in_register_00000009,locally_initiated_);
  pcVar4 = (char *)pipe_;
  pipe__local = pipe_;
  if (pipe_ == (pipe_t *)0x0) {
    pcVar4 = "Assertion failed: %s (%s:%d)\n";
    __n = 
    "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
    ;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","pipe_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
            ,0x4e);
    fflush(_stderr);
    zmq_abort("pipe_");
  }
  if (this->_probe_router == true) {
    iVar2 = msg_t::init(&probe_msg,(EVP_PKEY_CTX *)pcVar4);
    __buf = extraout_RDX;
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      __n = 
      "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
      ;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0x53);
      fflush(_stderr);
      zmq_abort(pcVar4);
      __buf = extraout_RDX_00;
    }
    pmVar5 = &probe_msg;
    pipe_t::write(pipe_,(int)&probe_msg,__buf,(size_t)__n);
    iVar2 = (int)pmVar5;
    pipe_t::flush(pipe_);
    iVar2 = msg_t::close(&probe_msg,iVar2);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0x5c);
      fflush(_stderr);
      zmq_abort(pcVar4);
    }
  }
  bVar1 = identify_peer(this,pipe_,locally_initiated_);
  if (bVar1) {
    fq_t::attach(&this->_fq,pipe_);
  }
  else {
    std::
    _Rb_tree<zmq::pipe_t*,zmq::pipe_t*,std::_Identity<zmq::pipe_t*>,std::less<zmq::pipe_t*>,std::allocator<zmq::pipe_t*>>
    ::_M_insert_unique<zmq::pipe_t*const&>
              ((_Rb_tree<zmq::pipe_t*,zmq::pipe_t*,std::_Identity<zmq::pipe_t*>,std::less<zmq::pipe_t*>,std::allocator<zmq::pipe_t*>>
                *)&this->_anonymous_pipes,&pipe__local);
  }
  return;
}

Assistant:

void zmq::router_t::xattach_pipe (pipe_t *pipe_,
                                  bool subscribe_to_all_,
                                  bool locally_initiated_)
{
    LIBZMQ_UNUSED (subscribe_to_all_);

    zmq_assert (pipe_);

    if (_probe_router) {
        msg_t probe_msg;
        int rc = probe_msg.init ();
        errno_assert (rc == 0);

        rc = pipe_->write (&probe_msg);
        // zmq_assert (rc) is not applicable here, since it is not a bug.
        LIBZMQ_UNUSED (rc);

        pipe_->flush ();

        rc = probe_msg.close ();
        errno_assert (rc == 0);
    }

    const bool routing_id_ok = identify_peer (pipe_, locally_initiated_);
    if (routing_id_ok)
        _fq.attach (pipe_);
    else
        _anonymous_pipes.insert (pipe_);
}